

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type __thiscall wasm::anon_unknown_0::TupleStore::insert(TupleStore *this,Tuple *info)

{
  iterator iVar1;
  __hashtable *__h;
  uintptr_t uVar2;
  key_type local_60;
  ulong local_58;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_50;
  unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
  local_38;
  unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
  ptr;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_50,info);
  uVar2 = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar2 != 0) {
    if (uVar2 == 1) {
      uVar2 = (local_50._M_impl.super__Vector_impl_data._M_start)->id;
    }
    else {
      std::recursive_mutex::lock(&this->mutex);
      local_60._M_data = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_50;
      iVar1 = std::
              _Hashtable<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::hash<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->typeIDs)._M_h,&local_60);
      if (iVar1.
          super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        make_unique<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::vector<wasm::Type,std::allocator<wasm::Type>>const&>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_38);
        uVar2 = (ulong)local_38._M_t.
                       super___uniq_ptr_impl<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_*,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_*,_false>
                       ._M_head_impl | 1;
        if (uVar2 < 7) {
          __assert_fail("id > Type::_last_basic_type",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                        ,0x210,
                        "auto wasm::(anonymous namespace)::TupleStore::doInsert(const std::vector<wasm::Type> &)::(anonymous class)::operator()() const"
                       );
        }
        local_60._M_data =
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
             local_38._M_t.
             super___uniq_ptr_impl<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_*,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
             .super__Head_base<0UL,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_*,_false>.
             _M_head_impl;
        local_58 = uVar2;
        std::
        _Hashtable<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>,std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>,std::allocator<std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::hash<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>>
                  ((_Hashtable<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>,std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>,std::allocator<std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::hash<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->typeIDs);
        std::
        vector<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>,std::allocator<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>>>
        ::
        emplace_back<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>>
                  ((vector<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>,std::allocator<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>>>
                    *)&this->constructedTuples,&local_38);
        std::
        unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
        ::~unique_ptr(&local_38);
      }
      else {
        uVar2 = *(uintptr_t *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_true>
                        ._M_cur + 0x10);
      }
      pthread_mutex_unlock((pthread_mutex_t *)this);
    }
  }
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_50);
  return (Type)uVar2;
}

Assistant:

Type insert(const Tuple& info) { return doInsert(info); }